

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.h
# Opt level: O0

Vector3 * operator+(Vector3 *u,Vector3 *v)

{
  Vector3 *in_RDX;
  Vector3 *in_RSI;
  Vector3 *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = Vector3::getX(in_RSI);
  dVar2 = Vector3::getX(in_RDX);
  dVar3 = Vector3::getY(in_RSI);
  dVar4 = Vector3::getY(in_RDX);
  dVar5 = Vector3::getZ(in_RSI);
  dVar6 = Vector3::getZ(in_RDX);
  Vector3::Vector3(in_RDI,dVar1 + dVar2,dVar3 + dVar4,dVar5 + dVar6);
  return in_RDI;
}

Assistant:

inline Vector3 operator+(const Vector3 &u, const Vector3 &v) {
    return {u.getX() + v.getX(), u.getY() + v.getY(), u.getZ() + v.getZ()};
}